

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O3

bool arangodb::velocypack::Collection::any(Slice slice,Predicate *predicate)

{
  bool bVar1;
  unsigned_long uVar2;
  Slice s;
  ArrayIterator it;
  Slice local_58;
  unsigned_long local_50;
  ArrayIterator local_48;
  
  ArrayIterator::ArrayIterator(&local_48,slice);
  if (local_48._position != local_48._size) {
    uVar2 = 0;
    do {
      local_58 = ArrayIterator::value(&local_48);
      local_50 = uVar2;
      if ((predicate->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar1 = (*predicate->_M_invoker)((_Any_data *)predicate,&local_58,&local_50);
      if (bVar1) {
        return true;
      }
      ArrayIterator::next(&local_48);
      uVar2 = uVar2 + 1;
    } while (local_48._position != local_48._size);
  }
  return false;
}

Assistant:

bool Collection::any(Slice slice, Predicate const& predicate) {
  ArrayIterator it(slice);
  ValueLength index = 0;

  while (it.valid()) {
    Slice s = it.value();
    if (predicate(s, index)) {
      return true;
    }
    it.next();
    ++index;
  }

  return false;
}